

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  ImFontGlyph *pIVar1;
  bool bVar2;
  int iVar3;
  value_type *pvVar4;
  ImWchar *pIVar5;
  uchar *puVar6;
  ImFontGlyph *pIVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  int local_2e4;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  float local_2cc;
  float local_2c8;
  float dummy_y;
  float dummy_x;
  stbtt_aligned_quad q;
  int codepoint;
  stbtt_packedchar *pc;
  int char_idx;
  stbtt_pack_range *range_1;
  int i_2;
  float off_y;
  float off_x;
  float descent;
  float ascent;
  int unscaled_line_gap;
  int unscaled_descent;
  int unscaled_ascent;
  float font_scale;
  ImFont *dst_font;
  ImFontTempBuildData *tmp_3;
  ImFontConfig *cfg_4;
  long lStack_240;
  int input_i_4;
  stbrp_rect *r;
  uchar multiply_table [256];
  ImFontTempBuildData *tmp_2;
  ImFontConfig *cfg_3;
  ImVec2 IStack_120;
  int input_i_3;
  int local_118;
  int local_114;
  int i_1;
  int n;
  stbtt_pack_range *range;
  ImWchar *in_range_2;
  ushort *puStack_f8;
  int i;
  ImWchar *in_range_1;
  int font_ranges_count;
  int font_glyphs_count;
  ImFontTempBuildData *tmp_1;
  ImFontConfig *cfg_2;
  void *pvStack_d0;
  int input_i_2;
  stbtt_pack_range *buf_ranges;
  stbrp_rect *buf_rects;
  stbtt_packedchar *buf_packedchars;
  int buf_ranges_n;
  int buf_rects_n;
  int buf_packedchars_n;
  int font_offset;
  ImFontTempBuildData *tmp;
  ImFontConfig *cfg_1;
  void *pvStack_90;
  int input_i_1;
  ImFontTempBuildData *tmp_array;
  stbtt_pack_context spc;
  ushort *puStack_48;
  int max_tex_height;
  ImWchar *in_range;
  ImFontConfig *cfg;
  int local_30;
  int input_i;
  int total_ranges_count;
  int total_glyphs_count;
  ImVec2 local_20;
  ImFontAtlas *local_18;
  ImFontAtlas *atlas_local;
  
  local_18 = atlas;
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                  ,0x690,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  local_18->TexID = (ImTextureID)0x0;
  local_18->TexHeight = 0;
  local_18->TexWidth = 0;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  local_18->TexUvScale = local_20;
  ImVec2::ImVec2((ImVec2 *)&total_ranges_count,0.0,0.0);
  local_18->TexUvWhitePixel = _total_ranges_count;
  ImFontAtlas::ClearTexData(local_18);
  input_i = 0;
  local_30 = 0;
  for (cfg._4_4_ = 0; cfg._4_4_ < (local_18->ConfigData).Size; cfg._4_4_ = cfg._4_4_ + 1) {
    pvVar4 = ImVector<ImFontConfig>::operator[](&local_18->ConfigData,cfg._4_4_);
    if (pvVar4->GlyphRanges == (ImWchar *)0x0) {
      pIVar5 = ImFontAtlas::GetGlyphRangesDefault(local_18);
      pvVar4->GlyphRanges = pIVar5;
    }
    puStack_48 = pvVar4->GlyphRanges;
    while( true ) {
      bVar8 = false;
      if (*puStack_48 != 0) {
        bVar8 = puStack_48[1] != 0;
      }
      if (!bVar8) break;
      input_i = ((uint)puStack_48[1] - (uint)*puStack_48) + 1 + input_i;
      puStack_48 = puStack_48 + 2;
      local_30 = local_30 + 1;
    }
  }
  if (local_18->TexDesiredWidth < 1) {
    if (input_i < 0xfa1) {
      if (input_i < 0x7d1) {
        local_2dc = 0x200;
        if (1000 < input_i) {
          local_2dc = 0x400;
        }
      }
      else {
        local_2dc = 0x800;
      }
      local_2d8 = local_2dc;
    }
    else {
      local_2d8 = 0x1000;
    }
    local_2d4 = local_2d8;
  }
  else {
    local_2d4 = local_18->TexDesiredWidth;
  }
  local_18->TexWidth = local_2d4;
  local_18->TexHeight = 0;
  spc.nodes._4_4_ = 0x8000;
  memset(&tmp_array,0,0x38);
  iVar3 = stbtt_PackBegin((stbtt_pack_context *)&tmp_array,(uchar *)0x0,local_18->TexWidth,0x8000,0,
                          local_18->TexGlyphPadding,(void *)0x0);
  if (iVar3 == 0) {
    atlas_local._7_1_ = false;
  }
  else {
    stbtt_PackSetOversampling((stbtt_pack_context *)&tmp_array,1,1);
    ImFontAtlasBuildPackCustomRects(local_18,spc.user_allocator_context);
    pvStack_90 = ImGui::MemAlloc((long)(local_18->ConfigData).Size * 0xc0);
    for (cfg_1._4_4_ = 0; cfg_1._4_4_ < (local_18->ConfigData).Size; cfg_1._4_4_ = cfg_1._4_4_ + 1)
    {
      tmp = (ImFontTempBuildData *)
            ImVector<ImFontConfig>::operator[](&local_18->ConfigData,cfg_1._4_4_);
      _buf_packedchars_n = (stbtt_fontinfo *)((long)pvStack_90 + (long)cfg_1._4_4_ * 0xc0);
      bVar8 = false;
      if (*(ImFont **)&(tmp->FontInfo).subrs.cursor != (ImFont *)0x0) {
        bVar2 = ImFont::IsLoaded(*(ImFont **)&(tmp->FontInfo).subrs.cursor);
        bVar8 = true;
        if (bVar2) {
          bVar8 = *(ImFontAtlas **)(*(long *)&(tmp->FontInfo).subrs.cursor + 0x58) == local_18;
        }
      }
      if (!bVar8) {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6c3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      buf_rects_n = stbtt_GetFontOffsetForIndex
                              ((uchar *)(tmp->FontInfo).userdata,(tmp->FontInfo).fontstart);
      if (buf_rects_n < 0) {
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6c6,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      iVar3 = stbtt_InitFont(_buf_packedchars_n,(uchar *)(tmp->FontInfo).userdata,buf_rects_n);
      if (iVar3 == 0) {
        local_18->TexHeight = 0;
        local_18->TexWidth = 0;
        ImGui::MemFree(pvStack_90);
        return false;
      }
    }
    buf_ranges_n = 0;
    buf_packedchars._4_4_ = 0;
    buf_packedchars._0_4_ = 0;
    buf_rects = (stbrp_rect *)ImGui::MemAlloc((long)input_i * 0x1c);
    buf_ranges = (stbtt_pack_range *)ImGui::MemAlloc((long)input_i << 4);
    pvStack_d0 = ImGui::MemAlloc((long)local_30 * 0x28);
    memset(buf_rects,0,(long)input_i * 0x1c);
    memset(buf_ranges,0,(long)input_i << 4);
    memset(pvStack_d0,0,(long)local_30 * 0x28);
    for (cfg_2._4_4_ = 0; cfg_2._4_4_ < (local_18->ConfigData).Size; cfg_2._4_4_ = cfg_2._4_4_ + 1)
    {
      tmp_1 = (ImFontTempBuildData *)
              ImVector<ImFontConfig>::operator[](&local_18->ConfigData,cfg_2._4_4_);
      _font_ranges_count = (stbtt_fontinfo *)((long)pvStack_90 + (long)cfg_2._4_4_ * 0xc0);
      in_range_1._4_4_ = 0;
      in_range_1._0_4_ = 0;
      puStack_f8 = *(ushort **)&(tmp_1->FontInfo).indexToLocFormat;
      while( true ) {
        bVar8 = false;
        if (*puStack_f8 != 0) {
          bVar8 = puStack_f8[1] != 0;
        }
        if (!bVar8) break;
        in_range_1._4_4_ = ((uint)puStack_f8[1] - (uint)*puStack_f8) + 1 + in_range_1._4_4_;
        puStack_f8 = puStack_f8 + 2;
        in_range_1._0_4_ = (int)in_range_1 + 1;
      }
      *(void **)&_font_ranges_count[1].fontstart =
           (void *)((long)pvStack_d0 + (long)(int)buf_packedchars * 0x28);
      _font_ranges_count[1].loca = (int)in_range_1;
      buf_packedchars._0_4_ = (int)in_range_1 + (int)buf_packedchars;
      for (in_range_2._4_4_ = 0; in_range_2._4_4_ < (int)in_range_1;
          in_range_2._4_4_ = in_range_2._4_4_ + 1) {
        range = (stbtt_pack_range *)
                (*(ImWchar **)&(tmp_1->FontInfo).indexToLocFormat + (in_range_2._4_4_ << 1));
        _i_1 = (float *)(*(long *)&_font_ranges_count[1].fontstart + (long)in_range_2._4_4_ * 0x28);
        *_i_1 = (float)(tmp_1->FontInfo).numGlyphs;
        _i_1[1] = (float)(uint)*(ushort *)&range->font_size;
        _i_1[4] = (float)(((uint)*(ushort *)((long)&range->font_size + 2) -
                          (uint)*(ushort *)&range->font_size) + 1);
        *(long *)(_i_1 + 6) = (long)buf_rects + (long)buf_ranges_n * 0x1c;
        buf_ranges_n = (int)_i_1[4] + buf_ranges_n;
      }
      _font_ranges_count[1].userdata = &buf_ranges->font_size + (long)buf_packedchars._4_4_ * 4;
      *(int *)&_font_ranges_count[1].data = in_range_1._4_4_;
      buf_packedchars._4_4_ = in_range_1._4_4_ + buf_packedchars._4_4_;
      stbtt_PackSetOversampling
                ((stbtt_pack_context *)&tmp_array,(tmp_1->FontInfo).loca,(tmp_1->FontInfo).head);
      local_114 = stbtt_PackFontRangesGatherRects
                            ((stbtt_pack_context *)&tmp_array,_font_ranges_count,
                             *(stbtt_pack_range **)&_font_ranges_count[1].fontstart,
                             _font_ranges_count[1].loca,(stbrp_rect *)_font_ranges_count[1].userdata
                            );
      if (local_114 != in_range_1._4_4_) {
        __assert_fail("n == font_glyphs_count",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                      ,0x6f7,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      stbrp_pack_rects((stbrp_context *)spc.user_allocator_context,
                       (stbrp_rect *)_font_ranges_count[1].userdata,local_114);
      for (local_118 = 0; local_118 < local_114; local_118 = local_118 + 1) {
        if (*(int *)((long)_font_ranges_count[1].userdata + (long)local_118 * 0x10 + 0xc) != 0) {
          iVar3 = ImMax(local_18->TexHeight,
                        (uint)*(ushort *)
                               ((long)_font_ranges_count[1].userdata + (long)local_118 * 0x10 + 10)
                        + (uint)*(ushort *)
                                 ((long)_font_ranges_count[1].userdata + (long)local_118 * 0x10 + 6)
                       );
          local_18->TexHeight = iVar3;
        }
      }
    }
    if (buf_packedchars._4_4_ != input_i) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x6ff,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if (buf_ranges_n != input_i) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x700,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((int)buf_packedchars != local_30) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui_draw.cpp"
                    ,0x701,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((local_18->Flags & 1U) == 0) {
      local_2e4 = ImUpperPowerOfTwo(local_18->TexHeight);
    }
    else {
      local_2e4 = local_18->TexHeight + 1;
    }
    local_18->TexHeight = local_2e4;
    ImVec2::ImVec2(&stack0xfffffffffffffee0,1.0 / (float)local_18->TexWidth,
                   1.0 / (float)local_18->TexHeight);
    local_18->TexUvScale = IStack_120;
    puVar6 = (uchar *)ImGui::MemAlloc((long)(local_18->TexWidth * local_18->TexHeight));
    local_18->TexPixelsAlpha8 = puVar6;
    memset(local_18->TexPixelsAlpha8,0,(long)(local_18->TexWidth * local_18->TexHeight));
    spc._32_8_ = local_18->TexPixelsAlpha8;
    spc.pack_info._4_4_ = local_18->TexHeight;
    for (cfg_3._4_4_ = 0; cfg_3._4_4_ < (local_18->ConfigData).Size; cfg_3._4_4_ = cfg_3._4_4_ + 1)
    {
      pvVar4 = ImVector<ImFontConfig>::operator[](&local_18->ConfigData,cfg_3._4_4_);
      multiply_table._248_8_ = (long)pvStack_90 + (long)cfg_3._4_4_ * 0xc0;
      stbtt_PackSetOversampling
                ((stbtt_pack_context *)&tmp_array,pvVar4->OversampleH,pvVar4->OversampleV);
      stbtt_PackFontRangesRenderIntoRects
                ((stbtt_pack_context *)&tmp_array,(stbtt_fontinfo *)multiply_table._248_8_,
                 *(stbtt_pack_range **)(multiply_table._248_8_ + 0xb0),
                 *(int *)(multiply_table._248_8_ + 0xb8),
                 *(stbrp_rect **)(multiply_table._248_8_ + 0xa0));
      if ((pvVar4->RasterizerMultiply != 1.0) || (NAN(pvVar4->RasterizerMultiply))) {
        ImFontAtlasBuildMultiplyCalcLookupTable((uchar *)&r,pvVar4->RasterizerMultiply);
        for (lStack_240 = *(long *)(multiply_table._248_8_ + 0xa0);
            lStack_240 !=
            *(long *)(multiply_table._248_8_ + 0xa0) +
            (long)*(int *)(multiply_table._248_8_ + 0xa8) * 0x10; lStack_240 = lStack_240 + 0x10) {
          if (*(int *)(lStack_240 + 0xc) != 0) {
            ImFontAtlasBuildMultiplyRectAlpha8
                      ((uchar *)&r,(uchar *)spc._32_8_,(uint)*(ushort *)(lStack_240 + 8),
                       (uint)*(ushort *)(lStack_240 + 10),(uint)*(ushort *)(lStack_240 + 4),
                       (uint)*(ushort *)(lStack_240 + 6),spc.width);
          }
        }
      }
      *(undefined8 *)(multiply_table._248_8_ + 0xa0) = 0;
    }
    stbtt_PackEnd((stbtt_pack_context *)&tmp_array);
    ImGui::MemFree(buf_ranges);
    buf_ranges = (stbtt_pack_range *)0x0;
    for (cfg_4._4_4_ = 0; cfg_4._4_4_ < (local_18->ConfigData).Size; cfg_4._4_4_ = cfg_4._4_4_ + 1)
    {
      tmp_3 = (ImFontTempBuildData *)
              ImVector<ImFontConfig>::operator[](&local_18->ConfigData,cfg_4._4_4_);
      dst_font = (ImFont *)((long)pvStack_90 + (long)cfg_4._4_4_ * 0xc0);
      _unscaled_ascent = *(ImFont **)&(tmp_3->FontInfo).subrs.cursor;
      if (((ulong)(tmp_3->FontInfo).cff.data & 1) != 0) {
        ImFont::BuildLookupTable(_unscaled_ascent);
      }
      unscaled_descent =
           (int)stbtt_ScaleForPixelHeight
                          ((stbtt_fontinfo *)dst_font,(float)(tmp_3->FontInfo).numGlyphs);
      stbtt_GetFontVMetrics
                ((stbtt_fontinfo *)dst_font,&unscaled_line_gap,(int *)&ascent,(int *)&descent);
      iVar3 = -1;
      if (0.0 < (float)unscaled_line_gap) {
        iVar3 = 1;
      }
      fVar9 = ImFloor((float)unscaled_line_gap * (float)unscaled_descent + (float)iVar3);
      iVar3 = -1;
      if (0.0 < (float)(int)ascent) {
        iVar3 = 1;
      }
      fVar10 = ImFloor((float)(int)ascent * (float)unscaled_descent + (float)iVar3);
      ImFontAtlasBuildSetupFont(local_18,_unscaled_ascent,(ImFontConfig *)tmp_3,fVar9,fVar10);
      fVar9 = (float)(tmp_3->FontInfo).kern;
      fVar10 = (float)(tmp_3->FontInfo).gpos + (float)(int)(_unscaled_ascent->Ascent + 0.5);
      for (range_1._4_4_ = 0; range_1._4_4_ < (int)dst_font[1].FallbackAdvanceX;
          range_1._4_4_ = range_1._4_4_ + 1) {
        pIVar1 = dst_font[1].FallbackGlyph;
        for (pc._4_4_ = 0; pc._4_4_ < (int)pIVar1[range_1._4_4_].X1; pc._4_4_ = pc._4_4_ + 1) {
          register0x00000000 = (short *)(*(long *)&pIVar1[range_1._4_4_].U0 + (long)pc._4_4_ * 0x1c)
          ;
          if (((((*register0x00000000 != 0) || (register0x00000000[2] != 0)) ||
               (register0x00000000[1] != 0)) || (register0x00000000[3] != 0)) &&
             ((q.s1 = (float)((int)pIVar1[range_1._4_4_].AdvanceX + pc._4_4_),
              ((ulong)(tmp_3->FontInfo).cff.data & 1) == 0 ||
              (pIVar7 = ImFont::FindGlyphNoFallback(_unscaled_ascent,SUB42(q.s1,0)),
              pIVar7 == (ImFontGlyph *)0x0)))) {
            local_2c8 = 0.0;
            local_2cc = 0.0;
            stbtt_GetPackedQuad(*(stbtt_packedchar **)&pIVar1[range_1._4_4_].U0,local_18->TexWidth,
                                local_18->TexHeight,pc._4_4_,&local_2c8,&local_2cc,
                                (stbtt_aligned_quad *)&dummy_y,0);
            ImFont::AddGlyph(_unscaled_ascent,SUB42(q.s1,0),dummy_y + fVar9,dummy_x + fVar10,
                             q.s0 + fVar9,q.t0 + fVar10,q.x0,q.y0,q.x1,q.y1,
                             *(float *)(stack0xfffffffffffffd60 + 8));
          }
        }
      }
    }
    ImGui::MemFree(buf_rects);
    ImGui::MemFree(pvStack_d0);
    ImGui::MemFree(pvStack_90);
    ImFontAtlasBuildFinish(local_18);
    atlas_local._7_1_ = true;
  }
  return atlas_local._7_1_;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Pack
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        for (int i = 0; i < n; i++)
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}